

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int find_jump_target(JSFunctionDef *s,int label,int *pop,int *pline)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t *in_RCX;
  uint *in_RDX;
  uint32_t in_ESI;
  JSFunctionDef *in_RDI;
  int op;
  int pos;
  int i;
  uint local_2c;
  int local_28;
  int local_24;
  uint32_t local_c;
  
  update_label(in_RDI,in_ESI,-1);
  local_c = in_ESI;
  for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
    local_28 = in_RDI->label_slots[(int)local_c].pos2;
    while( true ) {
      bVar1 = (in_RDI->byte_code).buf[local_28];
      local_2c = (uint)bVar1;
      if (bVar1 == 0xe) goto LAB_001a7681;
      if (bVar1 == 0x6b) break;
      if (bVar1 != 0xb4) {
        if (bVar1 != 0xc0) goto LAB_001a76e2;
        if (in_RCX != (uint32_t *)0x0) {
          uVar2 = get_u32((in_RDI->byte_code).buf + (long)local_28 + 1);
          *in_RCX = uVar2;
        }
      }
      local_28 = (uint)opcode_info[(int)local_2c].size + local_28;
    }
    local_c = get_u32((in_RDI->byte_code).buf + (long)local_28 + 1);
  }
LAB_001a76e2:
  *in_RDX = local_2c;
  update_label(in_RDI,local_c,1);
  return local_c;
LAB_001a7681:
  do {
    local_28 = local_28 + 1;
  } while ((in_RDI->byte_code).buf[local_28] == '\x0e');
  if ((in_RDI->byte_code).buf[local_28] == ')') {
    local_2c = 0x29;
  }
  goto LAB_001a76e2;
}

Assistant:

static int find_jump_target(JSFunctionDef *s, int label, int *pop, int *pline)
{
    int i, pos, op;

    update_label(s, label, -1);
    for (i = 0; i < 10; i++) {
        assert(label >= 0 && label < s->label_count);
        pos = s->label_slots[label].pos2;
        for (;;) {
            switch(op = s->byte_code.buf[pos]) {
            case OP_line_num:
                if (pline)
                    *pline = get_u32(s->byte_code.buf + pos + 1);
                /* fall thru */
            case OP_label:
                pos += opcode_info[op].size;
                continue;
            case OP_goto:
                label = get_u32(s->byte_code.buf + pos + 1);
                break;
            case OP_drop:
                /* ignore drop opcodes if followed by OP_return_undef */
                while (s->byte_code.buf[++pos] == OP_drop)
                    continue;
                if (s->byte_code.buf[pos] == OP_return_undef)
                    op = OP_return_undef;
                /* fall thru */
            default:
                goto done;
            }
            break;
        }
    }
    /* cycle detected, could issue a warning */
 done:
    *pop = op;
    update_label(s, label, +1);
    return label;
}